

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::gap(Fl_Graphics_Driver *this)

{
  bool bVar1;
  Fl_Graphics_Driver *this_local;
  
  while( true ) {
    bVar1 = false;
    if (this->gap_ + 2 < this->n) {
      bVar1 = false;
      if (this->p[this->n + -1].x == this->p[this->gap_].x) {
        bVar1 = this->p[this->n + -1].y == this->p[this->gap_].y;
      }
    }
    if (!bVar1) break;
    this->n = this->n + -1;
  }
  if (this->gap_ + 2 < this->n) {
    (*(this->super_Fl_Device)._vptr_Fl_Device[0x29])
              ((double)(int)this->p[this->gap_].x,(double)(int)this->p[this->gap_].y);
    this->gap_ = this->n;
  }
  else {
    this->n = this->gap_;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::gap() {
  while (n>gap_+2 && p[n-1].x == p[gap_].x && p[n-1].y == p[gap_].y) n--;
  if (n > gap_+2) {
    transformed_vertex((COORD_T)p[gap_].x, (COORD_T)p[gap_].y);
#if defined(WIN32)
    counts[numcount++] = n-gap_;
#endif
    gap_ = n;
  } else {
    n = gap_;
  }
}